

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall cmFindPackageCommand::FindConfig(cmFindPackageCommand *this)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string init;
  string local_88;
  undefined1 local_68 [32];
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  ComputePrefixes(this);
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_68._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
    local_68._0_8_ = (this->DebugBuffer)._M_string_length;
    local_68._16_8_ = 0x34;
    local_68._24_8_ = "find_package considered the following locations for ";
    local_40 = (this->Name)._M_dataplus._M_p;
    local_48 = (this->Name)._M_string_length;
    local_38 = 0x12;
    local_30 = "\'s Config module:\n";
    views._M_len = 4;
    views._M_array = (iterator)local_68;
    cmCatViews_abi_cxx11_(&local_88,views);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->super_cmFindCommon).SearchFrameworkFirst == false) &&
     ((this->super_cmFindCommon).SearchFrameworkOnly != true)) {
LAB_0027df36:
    if (((this->super_cmFindCommon).SearchAppBundleFirst == false) &&
       ((this->super_cmFindCommon).SearchAppBundleOnly != true)) {
      bVar3 = false;
LAB_0027df58:
      if (((this->super_cmFindCommon).SearchFrameworkOnly == false) &&
         ((this->super_cmFindCommon).SearchAppBundleOnly == false)) {
        bVar3 = FindPrefixedConfig(this);
      }
    }
    else {
      bVar3 = FindAppBundleConfig(this);
      if (!bVar3) goto LAB_0027df58;
    }
    if ((bVar3 == false) && ((this->super_cmFindCommon).SearchFrameworkLast == true)) {
      bVar3 = FindFrameworkConfig(this);
    }
    if ((bVar3 == false) && ((this->super_cmFindCommon).SearchAppBundleLast == true)) {
      bVar3 = FindAppBundleConfig(this);
    }
  }
  else {
    bVar2 = FindFrameworkConfig(this);
    bVar3 = true;
    if (!bVar2) goto LAB_0027df36;
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    if (bVar3 == false) {
      local_68._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
      local_68._0_8_ = (this->DebugBuffer)._M_string_length;
      local_68._16_8_ = 0x18;
      local_68._24_8_ = "The file was not found.\n";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_68;
      cmCatViews_abi_cxx11_(&local_88,views_01);
      std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
LAB_0027e12c:
      local_68._0_8_ = local_68 + 0x10;
      local_68._8_8_ = (char *)0x0;
      pcVar1 = (this->Variable)._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + (this->Variable)._M_string_length);
      std::__cxx11::string::append((char *)&local_88);
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
      goto LAB_0027e185;
    }
    local_68._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
    local_68._0_8_ = (this->DebugBuffer)._M_string_length;
    local_68._16_8_ = 0x18;
    local_68._24_8_ = "The file was found at\n  ";
    local_40 = (this->FileFound)._M_dataplus._M_p;
    local_48 = (this->FileFound)._M_string_length;
    local_38 = 1;
    local_30 = "\n";
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_68;
    cmCatViews_abi_cxx11_(&local_88,views_00);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
  }
  else {
    local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
    if (bVar3 == false) goto LAB_0027e12c;
  }
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (char *)0x0;
  cmsys::SystemTools::GetFilenamePath(&local_88,&this->FileFound);
  std::__cxx11::string::operator=((string *)local_68,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar2 = true;
LAB_0027e185:
  SetConfigDirCacheVariable(this,(string *)local_68);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::FindConfig()
{
  // Compute the set of search prefixes.
  this->ComputePrefixes();

  // Look for the project's configuration file.
  bool found = false;
  if (this->DebugMode) {
    this->DebugBuffer = cmStrCat(this->DebugBuffer,
                                 "find_package considered the following "
                                 "locations for ",
                                 this->Name, "'s Config module:\n");
  }

  // Search for frameworks.
  if (!found && (this->SearchFrameworkFirst || this->SearchFrameworkOnly)) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && (this->SearchAppBundleFirst || this->SearchAppBundleOnly)) {
    found = this->FindAppBundleConfig();
  }

  // Search prefixes.
  if (!found && !(this->SearchFrameworkOnly || this->SearchAppBundleOnly)) {
    found = this->FindPrefixedConfig();
  }

  // Search for frameworks.
  if (!found && this->SearchFrameworkLast) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && this->SearchAppBundleLast) {
    found = this->FindAppBundleConfig();
  }

  if (this->DebugMode) {
    if (found) {
      this->DebugBuffer = cmStrCat(
        this->DebugBuffer, "The file was found at\n  ", this->FileFound, "\n");
    } else {
      this->DebugBuffer =
        cmStrCat(this->DebugBuffer, "The file was not found.\n");
    }
  }

  // Store the entry in the cache so it can be set by the user.
  std::string init;
  if (found) {
    init = cmSystemTools::GetFilenamePath(this->FileFound);
  } else {
    init = this->Variable + "-NOTFOUND";
  }
  // We force the value since we do not get here if it was already set.
  this->SetConfigDirCacheVariable(init);

  return found;
}